

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_stage8_ssse3(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  longlong lVar7;
  longlong lVar8;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  __m128i alVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i alVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  alVar41 = x[2];
  alVar32 = x[6];
  lVar7 = x[7][0];
  uVar1 = *(undefined2 *)((long)x[7] + 2);
  uVar2 = *(undefined2 *)((long)x[7] + 4);
  uVar3 = *(undefined2 *)((long)x[7] + 6);
  lVar8 = x[7][1];
  uVar4 = *(undefined2 *)((long)x[7] + 10);
  uVar5 = *(undefined2 *)((long)x[7] + 0xc);
  uVar6 = *(undefined2 *)((long)x[7] + 0xe);
  auVar38._0_12_ = alVar41._0_12_;
  auVar38._12_2_ = alVar41[0]._6_2_;
  auVar38._14_2_ = *(undefined2 *)((long)x[3] + 6);
  auVar37._12_4_ = auVar38._12_4_;
  auVar37._0_10_ = alVar41._0_10_;
  auVar37._10_2_ = *(undefined2 *)((long)x[3] + 4);
  auVar36._10_6_ = auVar37._10_6_;
  auVar36._0_8_ = alVar41[0];
  auVar36._8_2_ = alVar41[0]._4_2_;
  auVar35._8_8_ = auVar36._8_8_;
  auVar35._6_2_ = *(undefined2 *)((long)x[3] + 2);
  auVar35._4_2_ = alVar41[0]._2_2_;
  auVar35._0_2_ = (undefined2)alVar41[0];
  auVar35._2_2_ = (short)x[3][0];
  auVar24._2_2_ = (short)x[3][1];
  auVar24._0_2_ = (short)alVar41[1];
  auVar24._4_2_ = alVar41[1]._2_2_;
  auVar24._6_2_ = *(undefined2 *)((long)x[3] + 10);
  auVar24._8_2_ = alVar41[1]._4_2_;
  auVar24._10_2_ = *(undefined2 *)((long)x[3] + 0xc);
  auVar24._12_2_ = alVar41[1]._6_2_;
  auVar24._14_2_ = *(undefined2 *)((long)x[3] + 0xe);
  auVar9._8_4_ = 0xb500b50;
  auVar9._0_8_ = 0xb500b500b500b50;
  auVar9._12_4_ = 0xb500b50;
  auVar45 = pmaddwd(auVar35,auVar9);
  auVar48 = pmaddwd(auVar24,auVar9);
  auVar22._8_4_ = 0xf4b00b50;
  auVar22._0_8_ = 0xf4b00b50f4b00b50;
  auVar22._12_4_ = 0xf4b00b50;
  auVar39 = pmaddwd(auVar35,auVar22);
  auVar25 = pmaddwd(auVar24,auVar22);
  auVar46._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar46._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar46._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar46._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar49._0_4_ = auVar48._0_4_ + in_XMM0_Da >> 0xc;
  auVar49._4_4_ = auVar48._4_4_ + in_XMM0_Db >> 0xc;
  auVar49._8_4_ = auVar48._8_4_ + in_XMM0_Dc >> 0xc;
  auVar49._12_4_ = auVar48._12_4_ + in_XMM0_Dd >> 0xc;
  alVar47 = (__m128i)packssdw(auVar46,auVar49);
  auVar40._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar40._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar40._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar40._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  auVar26._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar26._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar26._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar26._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar40,auVar26);
  x[2] = alVar47;
  x[3] = alVar41;
  auVar30._0_12_ = alVar32._0_12_;
  auVar30._12_2_ = alVar32[0]._6_2_;
  auVar30._14_2_ = uVar3;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = alVar32._0_10_;
  auVar29._10_2_ = uVar2;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = alVar32[0];
  auVar28._8_2_ = alVar32[0]._4_2_;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._6_2_ = uVar1;
  auVar27._4_2_ = alVar32[0]._2_2_;
  auVar27._0_2_ = (undefined2)alVar32[0];
  auVar27._2_2_ = (short)lVar7;
  auVar39._2_2_ = (short)lVar8;
  auVar39._0_2_ = (short)alVar32[1];
  auVar39._4_2_ = alVar32[1]._2_2_;
  auVar39._6_2_ = uVar4;
  auVar39._8_2_ = alVar32[1]._4_2_;
  auVar39._10_2_ = uVar5;
  auVar39._12_2_ = alVar32[1]._6_2_;
  auVar39._14_2_ = uVar6;
  auVar45 = pmaddwd(auVar27,auVar9);
  auVar42 = pmaddwd(auVar39,auVar9);
  auVar48 = pmaddwd(auVar27,auVar22);
  auVar25 = pmaddwd(auVar39,auVar22);
  auVar18._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar43._0_4_ = auVar42._0_4_ + in_XMM0_Da >> 0xc;
  auVar43._4_4_ = auVar42._4_4_ + in_XMM0_Db >> 0xc;
  auVar43._8_4_ = auVar42._8_4_ + in_XMM0_Dc >> 0xc;
  auVar43._12_4_ = auVar42._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar18,auVar43);
  auVar31._0_4_ = auVar48._0_4_ + in_XMM0_Da >> 0xc;
  auVar31._4_4_ = auVar48._4_4_ + in_XMM0_Db >> 0xc;
  auVar31._8_4_ = auVar48._8_4_ + in_XMM0_Dc >> 0xc;
  auVar31._12_4_ = auVar48._12_4_ + in_XMM0_Dd >> 0xc;
  auVar45._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar45._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar45._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar45._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  alVar32 = (__m128i)packssdw(auVar31,auVar45);
  x[6] = alVar41;
  x[7] = alVar32;
  alVar41 = x[10];
  auVar11._0_12_ = alVar41._0_12_;
  auVar11._12_2_ = alVar41[0]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)x[0xb] + 6);
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = alVar41._0_10_;
  auVar10._10_2_ = *(undefined2 *)((long)x[0xb] + 4);
  auVar42._10_6_ = auVar10._10_6_;
  auVar42._0_8_ = alVar41[0];
  auVar42._8_2_ = alVar41[0]._4_2_;
  auVar48._8_8_ = auVar42._8_8_;
  auVar48._6_2_ = *(undefined2 *)((long)x[0xb] + 2);
  auVar48._4_2_ = alVar41[0]._2_2_;
  auVar48._0_2_ = (undefined2)alVar41[0];
  auVar48._2_2_ = (short)x[0xb][0];
  auVar19._2_2_ = (short)x[0xb][1];
  auVar19._0_2_ = (short)alVar41[1];
  auVar19._4_2_ = alVar41[1]._2_2_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0xb] + 10);
  auVar19._8_2_ = alVar41[1]._4_2_;
  auVar19._10_2_ = *(undefined2 *)((long)x[0xb] + 0xc);
  auVar19._12_2_ = alVar41[1]._6_2_;
  auVar19._14_2_ = *(undefined2 *)((long)x[0xb] + 0xe);
  auVar45 = pmaddwd(auVar48,auVar9);
  auVar42 = pmaddwd(auVar19,auVar9);
  auVar25 = pmaddwd(auVar48,auVar22);
  auVar39 = pmaddwd(auVar19,auVar22);
  auVar33._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar33._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar33._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar33._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar44._0_4_ = auVar42._0_4_ + in_XMM0_Da >> 0xc;
  auVar44._4_4_ = auVar42._4_4_ + in_XMM0_Db >> 0xc;
  auVar44._8_4_ = auVar42._8_4_ + in_XMM0_Dc >> 0xc;
  auVar44._12_4_ = auVar42._12_4_ + in_XMM0_Dd >> 0xc;
  alVar32 = (__m128i)packssdw(auVar33,auVar44);
  auVar12._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar12._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar12._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar12._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  auVar20._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar20._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar20._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar20._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar12,auVar20);
  x[10] = alVar32;
  x[0xb] = alVar41;
  alVar41 = x[0xe];
  auVar16._0_12_ = alVar41._0_12_;
  auVar16._12_2_ = alVar41[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)x[0xf] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar41._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)x[0xf] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar41[0];
  auVar14._8_2_ = alVar41[0]._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = *(undefined2 *)((long)x[0xf] + 2);
  auVar13._4_2_ = alVar41[0]._2_2_;
  auVar13._0_2_ = (undefined2)alVar41[0];
  auVar13._2_2_ = (short)x[0xf][0];
  auVar21._2_2_ = (short)x[0xf][1];
  auVar21._0_2_ = (short)alVar41[1];
  auVar21._4_2_ = alVar41[1]._2_2_;
  auVar21._6_2_ = *(undefined2 *)((long)x[0xf] + 10);
  auVar21._8_2_ = alVar41[1]._4_2_;
  auVar21._10_2_ = *(undefined2 *)((long)x[0xf] + 0xc);
  auVar21._12_2_ = alVar41[1]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)x[0xf] + 0xe);
  auVar25 = pmaddwd(auVar13,auVar9);
  auVar9 = pmaddwd(auVar9,auVar21);
  auVar39 = pmaddwd(auVar13,auVar22);
  auVar22 = pmaddwd(auVar21,auVar22);
  auVar34._0_4_ = auVar25._0_4_ + in_XMM0_Da >> 0xc;
  auVar34._4_4_ = auVar25._4_4_ + in_XMM0_Db >> 0xc;
  auVar34._8_4_ = auVar25._8_4_ + in_XMM0_Dc >> 0xc;
  auVar34._12_4_ = auVar25._12_4_ + in_XMM0_Dd >> 0xc;
  auVar25._0_4_ = auVar9._0_4_ + in_XMM0_Da >> 0xc;
  auVar25._4_4_ = auVar9._4_4_ + in_XMM0_Db >> 0xc;
  auVar25._8_4_ = auVar9._8_4_ + in_XMM0_Dc >> 0xc;
  auVar25._12_4_ = auVar9._12_4_ + in_XMM0_Dd >> 0xc;
  alVar32 = (__m128i)packssdw(auVar34,auVar25);
  auVar17._0_4_ = auVar39._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar39._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar39._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar39._12_4_ + in_XMM0_Dd >> 0xc;
  auVar23._0_4_ = auVar22._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar17,auVar23);
  x[0xe] = alVar32;
  x[0xf] = alVar41;
  return;
}

Assistant:

static inline void iadst16_stage8_ssse3(__m128i *x, const int32_t *cospi,
                                        const __m128i __rounding,
                                        int8_t cos_bit) {
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[10], x[11], x[10], x[11]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[14], x[15], x[14], x[15]);
}